

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionRequestReliablePdu.cpp
# Opt level: O0

bool __thiscall
DIS::ActionRequestReliablePdu::operator==
          (ActionRequestReliablePdu *this,ActionRequestReliablePdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  const_reference this_01;
  const_reference rhs_01;
  ulong local_30;
  size_t idx_1;
  size_t idx;
  bool ivarsEqual;
  ActionRequestReliablePdu *rhs_local;
  ActionRequestReliablePdu *this_local;
  
  idx._7_1_ = SimulationManagementWithReliabilityFamilyPdu::operator==
                        (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                         &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  if (this->_requiredReliabilityService != rhs->_requiredReliabilityService) {
    idx._7_1_ = false;
  }
  if (this->_pad1 != rhs->_pad1) {
    idx._7_1_ = false;
  }
  if (this->_pad2 != rhs->_pad2) {
    idx._7_1_ = false;
  }
  if (this->_requestID != rhs->_requestID) {
    idx._7_1_ = false;
  }
  if (this->_actionID != rhs->_actionID) {
    idx._7_1_ = false;
  }
  idx_1 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                      (&this->_fixedDatumRecords);
    if (sVar2 <= idx_1) break;
    this_00 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                        (&this->_fixedDatumRecords,idx_1);
    rhs_00 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                       (&rhs->_fixedDatumRecords,idx_1);
    bVar1 = FixedDatum::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    idx_1 = idx_1 + 1;
  }
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                      (&this->_variableDatumRecords);
    if (sVar2 <= local_30) break;
    this_01 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                        (&this->_variableDatumRecords,local_30);
    rhs_01 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&rhs->_variableDatumRecords,local_30);
    bVar1 = VariableDatum::operator==(this_01,rhs_01);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_30 = local_30 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool ActionRequestReliablePdu::operator ==(const ActionRequestReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);

     if( ! (_requiredReliabilityService == rhs._requiredReliabilityService) ) ivarsEqual = false;
     if( ! (_pad1 == rhs._pad1) ) ivarsEqual = false;
     if( ! (_pad2 == rhs._pad2) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;
     if( ! (_actionID == rhs._actionID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _fixedDatumRecords.size(); idx++)
     {
        if( ! ( _fixedDatumRecords[idx] == rhs._fixedDatumRecords[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatumRecords.size(); idx++)
     {
        if( ! ( _variableDatumRecords[idx] == rhs._variableDatumRecords[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }